

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
visit(wasm::Expression*,wasm::IString_(void *this,Expression *curr,IString nextResult)

{
  undefined1 uVar1;
  _Rb_tree_color _Var2;
  iterator __position;
  pointer pSVar3;
  uint *puVar4;
  pointer ppEVar5;
  uintptr_t uVar6;
  _Base_ptr p_Var7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  Name name;
  Name name_00;
  ValueBuilder *this_00;
  size_t sVar11;
  SwitchCase *pSVar12;
  char *pcVar13;
  char *pcVar14;
  Module *pMVar15;
  ValueBuilder *pVVar16;
  undefined1 auVar17 [8];
  int iVar18;
  uint uVar21;
  Value *pVVar22;
  Ref args_2;
  Index IVar19;
  JsType JVar20;
  size_t *psVar23;
  mapped_type *pmVar24;
  undefined8 extraout_RAX;
  Value *this_01;
  long lVar25;
  undefined8 uVar26;
  Ref RVar27;
  Ref RVar28;
  size_type sVar29;
  const_iterator cVar30;
  _Base_ptr p_Var31;
  NameScope scope;
  pointer pSVar32;
  uint *puVar33;
  long lVar34;
  long lVar35;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  char *extraout_RDX_02;
  undefined8 *puVar37;
  _Base_ptr p_Var38;
  ArrayStorage *pAVar39;
  JsSign JVar40;
  void *pvVar41;
  Expression *pEVar42;
  Type TVar43;
  Wasm2JSBuilder *this_02;
  wasm2js *pwVar45;
  Module *pMVar46;
  Ref in_R8;
  Ref in_R9;
  pointer ppEVar47;
  size_t sVar48;
  ulong uVar49;
  ValueBuilder *this_03;
  bool bVar50;
  IString nextResult_00;
  IString nextResult_01;
  IString nextResult_02;
  IString nextResult_03;
  IString key;
  IString nextResult_04;
  IString specific;
  IString nextResult_05;
  IString nextResult_06;
  IString nextResult_07;
  IString nextResult_08;
  IString key_00;
  IString nextResult_09;
  IString nextResult_10;
  IString nextResult_11;
  IString nextResult_12;
  IString nextResult_13;
  IString nextResult_14;
  IString nextResult_15;
  IString nextResult_16;
  IString specific_00;
  IString nextResult_17;
  IString nextResult_18;
  IString nextResult_19;
  IString nextResult_20;
  IString specific_01;
  IString nextResult_21;
  IString nextResult_22;
  IString key_01;
  IString nextResult_23;
  IString nextResult_24;
  IString op;
  IString key_02;
  IString nextResult_25;
  IString nextResult_26;
  IString nextResult_27;
  IString nextResult_28;
  IString nextResult_29;
  IString op_00;
  IString specific_02;
  IString specific_03;
  IString nextResult_30;
  IString nextResult_31;
  IString op_01;
  IString nextResult_32;
  IString nextResult_33;
  IString nextResult_34;
  IString specific_04;
  IString specific_05;
  IString nextResult_35;
  IString nextResult_36;
  IString nextResult_37;
  IString op_02;
  IString op_03;
  IString op_04;
  IString target;
  IString op_05;
  IString target_00;
  IString target_01;
  IString target_02;
  IString label;
  IString name_01;
  Name name_02;
  IString target_03;
  IString target_04;
  IString op_06;
  IString target_05;
  IString op_07;
  IString op_08;
  IString target_06;
  IString target_07;
  IString target_08;
  IString target_09;
  IString op_09;
  IString target_10;
  undefined1 auVar51 [16];
  HeapAndPointer HVar52;
  string_view sVar53;
  IString IVar54;
  Expression EVar55;
  Name name_03;
  Name NVar56;
  undefined4 in_stack_fffffffffffffd78;
  Id IVar57;
  undefined4 uVar58;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 uVar59;
  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  targetIndexes;
  IString old;
  Name local_d8;
  mapped_type *local_c0;
  pointer pSStack_b8;
  SwitchCase *case_;
  Expression *local_a0;
  ulong local_98;
  undefined1 local_90 [8];
  Ref ret;
  Ref local_60;
  Ref local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  char *extraout_RDX;
  size_t sVar36;
  ValueBuilder *pVVar44;
  
  IVar54.str._M_str = (Value *)nextResult.str._M_str;
  specific_04.str._M_str = (char *)nextResult.str._M_len;
  uVar9 = *(undefined8 *)((long)this + 8);
  uVar10 = *(undefined8 *)((long)this + 0x10);
  *(char **)((long)this + 8) = specific_04.str._M_str;
  *(Value **)((long)this + 0x10) = IVar54.str._M_str;
  pVVar16 = _visitRefAs;
  pMVar15 = WASM_MEMORY_GROW;
  pSVar12 = _makeJsCoercedZero;
  pSVar32 = cashew::ATOMICS;
  sVar11 = _visitArrayCopy;
  this_00 = cashew::B_NOT;
  sVar48 = _str;
  this_03 = cashew::L_NOT;
  sVar36 = ___throw_logic_error;
  pVVar44 = cashew::MINUS;
  pMVar46 = MATH_CLZ32;
  if (curr == (Expression *)0x0) {
LAB_00148eb0:
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                  ,0x3a,
                  "ReturnType wasm::Visitor<ExpressionProcessor, cashew::Ref>::visit(Expression *) [SubType = ExpressionProcessor, ReturnType = cashew::Ref]"
                 );
  }
  switch(curr->_id) {
  case BlockId:
    lVar25 = (long)this + 0x180;
    lVar34 = lVar25;
    for (lVar35 = *(long *)((long)this + 0x188); lVar35 != 0;
        lVar35 = *(long *)(lVar35 + 0x10 + (ulong)bVar50 * 8)) {
      bVar50 = *(Expression **)(lVar35 + 0x20) < curr;
      if (!bVar50) {
        lVar34 = lVar35;
      }
    }
    lVar35 = lVar25;
    if ((lVar34 != lVar25) && (lVar35 = lVar34, curr < *(Expression **)(lVar34 + 0x20))) {
      lVar35 = lVar25;
    }
    if (lVar35 == lVar25) {
      IVar54.str._M_str = cashew::ValueBuilder::makeBlock();
      uVar6 = curr[2].type.id;
      if (uVar6 != 0) {
        uVar49 = 0;
        do {
          if (curr[2].type.id <= uVar49) goto LAB_00148ecf;
          nextResult_21.str._M_str = (char *)_finalize;
          nextResult_21.str._M_len = (size_t)NO_RESULT;
          RVar27 = IString_(this,*(Expression **)(*(long *)(curr + 2) + uVar49 * 8),nextResult_21);
          flattenAppend(IVar54.str._M_str,RVar27);
          uVar49 = uVar49 + 1;
        } while (uVar6 != uVar49);
      }
      specific_04.str._M_str = (char *)curr[1].type.id;
      if (specific_04.str._M_str == (char *)0x0) break;
      RVar27.inst = (Value *)0x3;
      name_02.super_IString.str._M_str = specific_04.str._M_str;
      name_02.super_IString.str._M_len = *(size_t *)(curr + 1);
      sVar53 = (string_view)fromName(*this,name_02,Label);
      goto LAB_00147e2c;
    }
    if (curr[2].type.id == 0) {
LAB_00148ecf:
      __assert_fail("index < usedElements",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                    ,0xbc,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    pEVar42 = (Expression *)**(undefined8 **)(curr + 2);
    IVar54.str._M_str = _finalize;
    specific_04.str._M_str = NO_RESULT;
    goto LAB_00147a60;
  case IfId:
    nextResult_11.str._M_str = (char *)cashew::RSHIFT;
    nextResult_11.str._M_len = EXPRESSION_RESULT;
    IVar54.str._M_str = IString_(this,*(Expression **)(curr + 1),nextResult_11);
    nextResult_12.str._M_str = (char *)_finalize;
    nextResult_12.str._M_len = (size_t)NO_RESULT;
    RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_12);
    if (*(Expression **)(curr + 2) == (Expression *)0x0) {
      RVar28.inst = (Value *)0x0;
    }
    else {
      nextResult_13.str._M_str = (char *)_finalize;
      nextResult_13.str._M_len = (size_t)NO_RESULT;
      RVar28 = IString_(this,*(Expression **)(curr + 2),nextResult_13);
    }
    IVar54.str._M_str = cashew::ValueBuilder::makeIf(IVar54.str._M_str,RVar27,RVar28);
    break;
  case LoopId:
    IVar57 = curr[1]._id;
    uVar58 = *(undefined4 *)&curr[1].field_0x4;
    targetIndexes._M_t._M_impl._0_4_ = *(undefined4 *)&curr[1].type.id;
    targetIndexes._M_t._M_impl._4_4_ = *(undefined4 *)((long)&curr[1].type.id + 4);
    local_90 = (undefined1  [8])((long)this + 0x1d8);
    std::
    _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
              ();
    IVar54.str._M_str = *(Value **)(curr + 2);
    RVar27 = IString_(this,IVar54.str._M_str,(IString)*(string_view *)((long)this + 8));
    if (*(long *)(*(long *)(curr + 2) + 8) == 0) {
      RVar27 = blockify(cashew::Ref_(RVar27.inst,IVar54.str._M_str);
      name.super_IString.str._M_len._4_4_ = uVar58;
      name.super_IString.str._M_len._0_4_ = IVar57;
      name.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
      name.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
      IVar54 = fromName(*this,name,Label);
      label.str._M_str = IVar54.str._M_str;
      label.str._M_len = (size_t)label.str._M_str;
      IVar54.str._M_str = cashew::ValueBuilder::makeBreak((ValueBuilder *)IVar54.str._M_len,label);
      flattenAppend(RVar27,IVar54.str._M_str);
    }
    else if (*(long *)(*(long *)(curr + 2) + 8) != 1) {
      __assert_fail("curr->body->type == Type::none",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                    ,0x4c0,
                    "Ref wasm::Wasm2JSBuilder::processFunctionBody(Module *, Function *, bool)::ExpressionProcessor::visitLoop(Loop *)"
                   );
    }
    pvVar41 = (void *)0x18;
    IVar54.str._M_str = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (IVar54.str._M_str)->type = Null;
    cashew::Value::free(IVar54.str._M_str,pvVar41);
    (IVar54.str._M_str)->type = Number;
    ((IVar54.str._M_str)->field_1).str.str._M_len = 0x3ff0000000000000;
    IVar54.str._M_str = cashew::ValueBuilder::makeWhile(IVar54.str._M_str,RVar27);
    name_00.super_IString.str._M_len._4_4_ = uVar58;
    name_00.super_IString.str._M_len._0_4_ = IVar57;
    name_00.super_IString.str._M_str._0_4_ = targetIndexes._M_t._M_impl._0_4_;
    name_00.super_IString.str._M_str._4_4_ = targetIndexes._M_t._M_impl._4_4_;
    RVar27.inst = (Value *)0x3;
    sVar53 = (string_view)fromName(*this,name_00,Label);
LAB_00147e2c:
    name_01.str._M_len = sVar53._M_str;
    name_01.str._M_str = (char *)IVar54.str._M_str;
    IVar54.str._M_str =
         cashew::ValueBuilder::makeLabel((ValueBuilder *)sVar53._M_len,name_01,RVar27);
    break;
  case BreakId:
    if (curr[2].type.id == 0) {
      IVar54.str._M_str = makeBreakOrContinue(wasm::Name_(this,(Name)curr[1]);
      break;
    }
    uVar6 = (curr->type).id;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = curr[1]._id;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
         *(undefined4 *)&curr[1].field_0x4;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)curr[1].type.id;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = *(_Base_ptr *)(curr + 2);
    targetIndexes._M_t._M_impl._0_4_ = SUB84(uVar6,0);
    targetIndexes._M_t._M_impl._4_4_ = SUB84(uVar6 >> 0x20,0);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    pEVar42 = (Expression *)local_90;
    local_90._0_4_ = 2;
    ret.inst = (Value *)0x0;
    goto LAB_00147a60;
  case SwitchId:
    nextResult_05.str._M_str = (char *)cashew::RSHIFT;
    nextResult_05.str._M_len = EXPRESSION_RESULT;
    local_a0 = curr;
    IVar54.str._M_str = IString_(this,(Expression *)curr[4].type.id,nextResult_05);
    IVar54.str._M_str = (Value *)makeJsCoercion(IVar54.str._M_str,JS_INT);
    IVar54.str._M_str = cashew::ValueBuilder::makeSwitch(IVar54.str._M_str);
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&targetIndexes
    ;
    targetIndexes._M_t._M_impl._0_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (curr[1].type.id != 0) {
      lVar25 = 0;
      uVar49 = 0;
      do {
        pmVar24 = std::
                  map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                  ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&stack0xfffffffffffffd78,
                               (key_type *)(*(long *)(curr + 1) + lVar25));
        local_90._0_4_ = (uint)uVar49;
        __position._M_current =
             (pmVar24->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pmVar24->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (pmVar24,__position,(uint *)local_90);
        }
        else {
          *__position._M_current = (uint)uVar49;
          (pmVar24->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar49 = uVar49 + 1;
        lVar25 = lVar25 + 0x10;
      } while (uVar49 < curr[1].type.id);
    }
    local_c0 = std::
               map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
               ::operator[]((map<wasm::Switch_*,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>,_std::less<wasm::Switch_*>,_std::allocator<std::pair<wasm::Switch_*const,_std::vector<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>_>_>_>
                             *)((long)this + 0x1a8),(key_type *)&local_a0);
    ret.inst = (Value *)((ulong)ret.inst._4_4_ << 0x20);
    pSVar32 = (local_c0->
              super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pSVar3 = (local_c0->
             super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar32 == pSVar3) {
      local_98 = 0;
    }
    else {
      local_98 = 0;
      do {
        local_d8.super_IString.str._M_len = (pSVar32->target).super_IString.str._M_len;
        local_d8.super_IString.str._M_str = (pSVar32->target).super_IString.str._M_str;
        pSStack_b8 = pSVar32;
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)local_90,&local_d8);
        if (local_d8.super_IString.str._M_str == (char *)curr[3].type.id) {
          cashew::ValueBuilder::appendDefaultToSwitch(IVar54.str._M_str);
        }
        else {
          pmVar24 = std::
                    map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator[]((map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                  *)&stack0xfffffffffffffd78,&local_d8);
          puVar4 = (pmVar24->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar33 = (pmVar24->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start; puVar33 != puVar4;
              puVar33 = puVar33 + 1) {
            uVar21 = *puVar33;
            pvVar41 = (void *)0x18;
            RVar27.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
            (RVar27.inst)->type = Null;
            cashew::Value::free(RVar27.inst,pvVar41);
            (RVar27.inst)->type = Number;
            ((RVar27.inst)->field_1).num = (double)uVar21;
            cashew::ValueBuilder::appendCaseToSwitch(IVar54.str._M_str,RVar27);
          }
        }
        ppEVar47 = (pSStack_b8->code).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar5 = (pSStack_b8->code).
                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (ppEVar47 != ppEVar5) {
          do {
            pVVar22 = (Value *)*ppEVar47;
            nextResult_06.str._M_str = (char *)_finalize;
            nextResult_06.str._M_len = (size_t)NO_RESULT;
            RVar27.inst = pVVar22;
            RVar28 = IString_(this,(Expression *)pVVar22,nextResult_06);
            RVar27 = blockify(cashew::Ref_(RVar28.inst,RVar27);
            cashew::ValueBuilder::appendCodeToSwitch(IVar54.str._M_str,RVar27,false);
            ppEVar47 = ppEVar47 + 1;
          } while (ppEVar47 != ppEVar5);
          local_98 = CONCAT71((int7)((ulong)extraout_RAX >> 8),
                              (pVVar22->field_1).str.str._M_len == 1);
        }
        pSVar32 = pSStack_b8 + 1;
      } while (pSVar32 != pSVar3);
    }
    if (targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)&targetIndexes) {
      bVar50 = false;
    }
    else {
      bVar50 = false;
      p_Var31 = targetIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        cVar30 = std::
                 _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                         *)local_90,(key_type *)(p_Var31 + 1));
        if (cVar30._M_node == (_Base_ptr)&ret) {
          if ((!bVar50) &&
             ((local_c0->
              super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
              )._M_impl.super__Vector_impl_data._M_start !=
              (local_c0->
              super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
              )._M_impl.super__Vector_impl_data._M_finish && (local_98 & 1) == 0)) {
            RVar28.inst = (Value *)0x0;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = extraout_RDX_00;
            RVar27 = cashew::ValueBuilder::makeBreak((ValueBuilder *)0x0,(IString)(auVar51 << 0x40))
            ;
            RVar27 = blockify(cashew::Ref_(RVar27.inst,RVar28);
            bVar50 = true;
            cashew::ValueBuilder::appendCodeToSwitch(IVar54.str._M_str,RVar27,false);
          }
          if (p_Var31[1]._M_parent != (_Base_ptr)local_a0[3].type.id) {
            p_Var7 = p_Var31[1]._M_right;
            for (p_Var38 = p_Var31[1]._M_left; p_Var38 != p_Var7;
                p_Var38 = (_Base_ptr)&p_Var38->field_0x4) {
              _Var2 = p_Var38->_M_color;
              pvVar41 = (void *)0x18;
              RVar27.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
              (RVar27.inst)->type = Null;
              cashew::Value::free(RVar27.inst,pvVar41);
              (RVar27.inst)->type = Number;
              ((RVar27.inst)->field_1).num = (double)_Var2;
              cashew::ValueBuilder::appendCaseToSwitch(IVar54.str._M_str,RVar27);
            }
            RVar27.inst = *(Value **)(p_Var31 + 1);
            RVar28 = makeBreakOrContinue(wasm::Name_(this,(Name)*(string_view *)(p_Var31 + 1));
            RVar27 = blockify(cashew::Ref_(RVar28.inst,RVar27);
            cashew::ValueBuilder::appendCodeToSwitch(IVar54.str._M_str,RVar27,false);
          }
        }
        p_Var31 = (_Base_ptr)std::_Rb_tree_increment(p_Var31);
      } while (p_Var31 != (_Rb_tree_node_base *)&targetIndexes);
    }
    pEVar42 = local_a0;
    cVar30 = std::
             _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
             ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                     *)local_90,(key_type *)(local_a0 + 3));
    if (cVar30._M_node == (_Base_ptr)&ret) {
      if ((!bVar50) &&
         ((local_c0->
          super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (local_c0->
          super__Vector_base<SwitchProcessor::SwitchCase,_std::allocator<SwitchProcessor::SwitchCase>_>
          )._M_impl.super__Vector_impl_data._M_finish && (local_98 & 1) == 0)) {
        RVar28.inst = (Value *)0x0;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = extraout_RDX_01;
        RVar27 = cashew::ValueBuilder::makeBreak((ValueBuilder *)0x0,(IString)(auVar8 << 0x40));
        RVar27 = blockify(cashew::Ref_(RVar27.inst,RVar28);
        cashew::ValueBuilder::appendCodeToSwitch(IVar54.str._M_str,RVar27,false);
      }
      cashew::ValueBuilder::appendDefaultToSwitch(IVar54.str._M_str);
      RVar27.inst = *(Value **)(pEVar42 + 3);
      RVar28 = makeBreakOrContinue(wasm::Name_(this,(Name)pEVar42[3]);
      RVar27 = blockify(cashew::Ref_(RVar28.inst,RVar27);
      cashew::ValueBuilder::appendCodeToSwitch(IVar54.str._M_str,RVar27,false);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_90);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)&stack0xfffffffffffffd78);
    break;
  case CallId:
    if ((char)curr[4]._id == BlockId) {
      Fatal::Fatal((Fatal *)&stack0xfffffffffffffd78);
      Fatal::operator<<((Fatal *)&stack0xfffffffffffffd78,
                        (char (*) [40])"tail calls not yet supported in wasm2js");
      goto LAB_00149134;
    }
    IVar54 = fromName(*this,(Name)curr[3],Top);
    target_00.str._M_str = (uintptr_t)IVar54.str._M_str;
    target_00.str._M_len = target_00.str._M_str;
    IVar54.str._M_str = cashew::ValueBuilder::makeCall((ValueBuilder *)IVar54.str._M_len,target_00);
    uVar58 = SUB84(IVar54.str._M_str,0);
    uVar59 = (undefined4)((ulong)IVar54.str._M_str >> 0x20);
    bVar50 = true;
    if ((*(int *)(*this + 100) != 0) && (*(char *)((long)this + 0x28) == '\0')) {
      target_00.str._M_str = *(uintptr_t *)(curr + 3);
      NVar56.super_IString.str._M_str = (char *)target_00.str._M_str;
      NVar56.super_IString.str._M_len = *(size_t *)((long)this + 0x20);
      lVar25 = ::wasm::Module::getFunction(NVar56);
      bVar50 = *(long *)(lVar25 + 0x20) != 0;
    }
    uVar6 = curr[1].type.id;
    if (uVar6 != 0) {
      uVar49 = 0;
      do {
        if (curr[1].type.id <= uVar49) goto LAB_00148ecf;
        pEVar42 = *(Expression **)(*(long *)(curr + 1) + uVar49 * 8);
        nextResult_16.str._M_str = (char *)cashew::RSHIFT;
        nextResult_16.str._M_len = EXPRESSION_RESULT;
        TVar43.id = (uintptr_t)pEVar42;
        target_00.str._M_str = (uintptr_t)IString_(this,pEVar42,nextResult_16);
        if (bVar50) {
          JVar20 = ::wasm::wasmToJsType((wasm *)(pEVar42->type).id,TVar43);
          target_00.str._M_str = makeJsCoercion((Ref)target_00.str._M_str,JVar20);
        }
        puVar37 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xfffffffffffffd78);
        cashew::Value::push_back((Value *)*puVar37,(Ref)target_00.str._M_str);
        uVar49 = uVar49 + 1;
      } while (uVar6 != uVar49);
    }
    if (bVar50) {
      RVar28.inst._4_4_ = uVar59;
      RVar28.inst._0_1_ = SUB41(uVar58,0);
      RVar28.inst._1_3_ = SUB43(uVar58,1);
      JVar20 = ::wasm::wasmToJsType((wasm *)(curr->type).id,target_00.str._M_str);
      uVar26 = makeJsCoercion(RVar28,JVar20);
      uVar58 = (undefined4)uVar26;
      uVar59 = (undefined4)((ulong)uVar26 >> 0x20);
    }
    IVar54.str._M_str = (Value *)CONCAT44(uVar59,uVar58);
    break;
  case CallIndirectId:
    IVar54.str._M_str = visitCallIndirect(wasm::CallIndirect__(this,(CallIndirect *)curr);
    break;
  case LocalGetId:
    sVar53 = (string_view)
             ::wasm::Function::getLocalNameOrGeneric((uint)*(undefined8 *)((long)this + 0x18));
    this_02 = *this;
    scope = Local;
    goto LAB_00147943;
  case LocalSetId:
    pEVar42 = (Expression *)curr[1].type.id;
    EVar55 = (Expression)
             ::wasm::Function::getLocalNameOrGeneric((uint)*(undefined8 *)((long)this + 0x18));
    specific_04.str._M_str = (char *)0x2;
    goto LAB_00147d3c;
  case GlobalGetId:
    sVar53 = *(string_view *)(curr + 1);
    this_02 = *this;
    scope = Top;
LAB_00147943:
    sVar53 = (string_view)fromName(this_02,(Name)sVar53,scope);
    pvVar41 = (void *)0x18;
    IVar54.str._M_str = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (IVar54.str._M_str)->type = Null;
    cashew::Value::free(IVar54.str._M_str,pvVar41);
    (IVar54.str._M_str)->type = String;
    ((IVar54.str._M_str)->field_1).str.str = sVar53;
    break;
  case GlobalSetId:
    pEVar42 = *(Expression **)(curr + 2);
    EVar55 = curr[1];
    specific_04.str._M_str = (char *)0x1;
LAB_00147d3c:
    name_03.super_IString.str._M_len = EVar55.type.id;
    name_03.super_IString.str._M_str = specific_04.str._M_str;
    IVar54.str._M_str =
         makeSetVar(wasm::Expression*,wasm::Expression*,wasm::Name,wasm::NameScope_
                   (this,pEVar42,EVar55._0_8_,name_03,(NameScope)in_R9.inst);
    break;
  case LoadId:
    if ((*(Value **)(curr + 2) != (Value *)0x0) &&
       (IVar54.str._M_str = (Value *)(ulong)(byte)(char)curr[1]._id,
       *(Value **)(curr + 2) != IVar54.str._M_str)) {
      __assert_fail("curr->align == 0 || curr->align == curr->bytes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                    ,0x5a8,
                    "Ref wasm::Wasm2JSBuilder::processFunctionBody(Module *, Function *, bool)::ExpressionProcessor::visitLoad(Load *)"
                   );
    }
    RVar27 = makePointer(wasm::Expression*,wasm::Address_
                       (this,*(Expression **)(curr + 3),(Address)curr[1].type.id);
    pcVar14 = MIN;
    sVar11 = cashew::HEAPF32;
    pcVar13 = _finalize;
    sVar48 = cashew::HEAPF64;
    specific_04.str._M_str = _visitStringEncode;
    sVar36 = cashew::HEAP32;
    local_90 = (undefined1  [8])0x0;
    uVar49 = (curr->type).id;
    if (6 < uVar49) {
LAB_00148eee:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                    ,0xc6,"BasicType wasm::Type::getBasic() const");
    }
    iVar18 = (int)uVar49;
    if (iVar18 == 5) {
      pvVar41 = (void *)0x18;
      RVar28.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar28.inst)->type = Null;
      cashew::Value::free(RVar28.inst,pvVar41);
      (RVar28.inst)->type = String;
      ((RVar28.inst)->field_1).str.str._M_len = sVar48;
      ((RVar28.inst)->field_1).str.str._M_str = pcVar13;
      iVar18 = 3;
LAB_00148464:
      target_00.str._M_str = (uintptr_t)cashew::ValueBuilder::makePtrShift(RVar27,iVar18);
      local_90 = (undefined1  [8])cashew::ValueBuilder::makeSub(RVar28,(Ref)target_00.str._M_str);
    }
    else {
      if (iVar18 == 4) {
        pvVar41 = (void *)0x18;
        RVar28.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar28.inst)->type = Null;
        cashew::Value::free(RVar28.inst,pvVar41);
        (RVar28.inst)->type = String;
        ((RVar28.inst)->field_1).str.str._M_len = sVar11;
        ((RVar28.inst)->field_1).str.str._M_str = pcVar14;
        iVar18 = 2;
        goto LAB_00148464;
      }
      if (iVar18 != 2) {
        Fatal::Fatal((Fatal *)&stack0xfffffffffffffd78);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                   "Unhandled type in load: ",0x18);
        Fatal::operator<<((Fatal *)&stack0xfffffffffffffd78,&curr->type);
        goto LAB_00149134;
      }
      uVar1 = (undefined1)curr[1]._id;
      if (uVar1 != BreakId) {
        if (uVar1 == IfId) {
          if (((uVar49 < 6) &&
              (IVar54.str._M_str = (Value *)0x32, (0x32UL >> (uVar49 & 0x3f) & 1) != 0)) ||
             ((uVar21 = ::wasm::Type::getByteSize(), uVar21 <= (byte)uVar1 ||
              (*(byte *)((long)&curr[1]._id + 1) == 0)))) {
            psVar23 = &cashew::HEAPU16;
          }
          else {
            psVar23 = &cashew::HEAP16;
          }
          sVar36 = *psVar23;
          specific_04.str._M_str = (char *)psVar23[1];
          pvVar41 = (void *)0x18;
          RVar28.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
          (RVar28.inst)->type = Null;
          cashew::Value::free(RVar28.inst,pvVar41);
          (RVar28.inst)->type = String;
          ((RVar28.inst)->field_1).str.str._M_len = sVar36;
          ((RVar28.inst)->field_1).str.str._M_str = specific_04.str._M_str;
          iVar18 = 1;
        }
        else {
          if ((byte)uVar1 != 1) {
            Fatal::Fatal((Fatal *)&stack0xfffffffffffffd78);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                       "Unhandled number of bytes in i32 load: ",0x27);
            Fatal::operator<<((Fatal *)&stack0xfffffffffffffd78,(uchar *)(curr + 1));
            goto LAB_00149134;
          }
          if ((((uVar49 < 6) &&
               (IVar54.str._M_str = (Value *)0x32, (0x32UL >> (uVar49 & 0x3f) & 1) != 0)) ||
              (uVar21 = ::wasm::Type::getByteSize(), uVar21 < 2)) ||
             (*(byte *)((long)&curr[1]._id + 1) == 0)) {
            psVar23 = &cashew::HEAPU8;
          }
          else {
            psVar23 = &cashew::HEAP8;
          }
          sVar36 = *psVar23;
          specific_04.str._M_str = (char *)psVar23[1];
          pvVar41 = (void *)0x18;
          RVar28.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
          (RVar28.inst)->type = Null;
          cashew::Value::free(RVar28.inst,pvVar41);
          (RVar28.inst)->type = String;
          ((RVar28.inst)->field_1).str.str._M_len = sVar36;
          ((RVar28.inst)->field_1).str.str._M_str = specific_04.str._M_str;
          iVar18 = 0;
        }
        goto LAB_00148464;
      }
      pvVar41 = (void *)0x18;
      RVar28.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar28.inst)->type = Null;
      cashew::Value::free(RVar28.inst,pvVar41);
      (RVar28.inst)->type = String;
      ((RVar28.inst)->field_1).str.str._M_len = sVar36;
      ((RVar28.inst)->field_1).str.str._M_str = specific_04.str._M_str;
      target_00.str._M_str = (uintptr_t)cashew::ValueBuilder::makePtrShift(RVar27,2);
      local_90 = (undefined1  [8])cashew::ValueBuilder::makeSub(RVar28,(Ref)target_00.str._M_str);
    }
    pSVar12 = _makeJsCoercedZero;
    pSVar32 = cashew::ATOMICS;
    if ((char)curr[2].type.id == '\x01') {
      pvVar41 = (void *)0x18;
      pVVar22 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar22->type = Null;
      cashew::Value::free(pVVar22,pvVar41);
      pVVar22->type = String;
      (pVVar22->field_1).str.str._M_len = (size_t)pSVar32;
      (pVVar22->field_1).str.str._M_str = (char *)pSVar12;
      key_02.str._M_str = (char *)IVar54.str._M_str;
      key_02.str._M_len = std::cerr;
      IVar54.str._M_str = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar22,cashew::LOAD,key_02)
      ;
      IVar54.str._M_str = cashew::ValueBuilder::makeCall(IVar54.str._M_str);
      puVar37 = (undefined8 *)cashew::Ref::operator[]((uint)local_90);
      cashew::ValueBuilder::appendToCall(IVar54.str._M_str,(Value *)*puVar37);
      puVar37 = (undefined8 *)cashew::Ref::operator[]((uint)local_90);
      target_00.str._M_str = *puVar37;
      cashew::ValueBuilder::appendToCall(IVar54.str._M_str,(Ref)target_00.str._M_str);
      local_90 = (undefined1  [8])IVar54.str._M_str;
    }
    auVar17 = local_90;
    if ((*(int *)(*this + 100) == 0) ||
       (IVar54.str._M_str = (Value *)local_90, (*(byte *)((long)this + 0x28) & 1) != 0)) {
      JVar20 = ::wasm::wasmToJsType((wasm *)(curr->type).id,target_00.str._M_str);
      IVar54.str._M_str = (Value *)makeJsCoercion((Ref)auVar17,JVar20);
    }
    break;
  case StoreId:
    IVar54.str._M_str = visitStore(wasm::Store__(this,(Store *)curr);
    break;
  case ConstId:
    IVar54.str._M_str =
         visitConst(wasm::Const__(curr,(Const *)&switchD_00146fc9::switchdataD_001850a8);
    break;
  case UnaryId:
    uVar49 = (curr->type).id;
    local_90 = (undefined1  [8])curr;
    if (6 < uVar49) goto LAB_00148eee;
    iVar18 = (int)uVar49;
    if (1 < iVar18 - 4U) {
      if (iVar18 != 2) {
        Fatal::Fatal((Fatal *)&stack0xfffffffffffffd78);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                   "Unhandled type in unary: ",0x19);
        Fatal::operator<<((Fatal *)&stack0xfffffffffffffd78,(Unary **)local_90);
        goto LAB_00149134;
      }
      IVar57 = curr[1]._id;
      if ((int)IVar57 < 0x14) {
        if (IVar57 != InvalidId) {
          if ((IVar57 == IfId) || (IVar57 == BreakId)) {
            ::wasm::handle_unreachable
                      ("i32 unary should have been removed",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                       ,0x671);
          }
          goto switchD_0014832c_caseD_31;
        }
        nextResult_22.str._M_str = (char *)cashew::RSHIFT;
        nextResult_22.str._M_len = EXPRESSION_RESULT;
        IVar54.str._M_str = cashew::RSHIFT;
        RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_22);
        goto LAB_00148130;
      }
      IVar54.str._M_str = cashew::RSHIFT;
      if (IVar57 - MemorySizeId < 0xe) {
        specific_04.str._M_str =
             (char *)((long)&switchD_001485e5::switchdataD_0018541c +
                     (long)(int)(&switchD_001485e5::switchdataD_0018541c)[IVar57 - MemorySizeId]);
        switch(IVar57) {
        case MemorySizeId:
          nextResult_36.str._M_str = (char *)cashew::RSHIFT;
          nextResult_36.str._M_len = EXPRESSION_RESULT;
          RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_36);
          break;
        default:
          goto switchD_0014832c_caseD_31;
        case AtomicCmpxchgId:
        case SIMDExtractId:
          goto switchD_0014832c_caseD_34;
        case AtomicNotifyId:
        case SIMDShuffleId:
          goto switchD_0014832c_caseD_35;
        case SIMDShiftId:
          specific_04.str._M_len = _visitSIMDShift;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_F32,specific_04);
          specific_05.str._M_str = specific_04.str._M_str;
          specific_05.str._M_len = _finalize;
          ABI::wasm2js::ensureHelpers
                    (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_LOAD_I32,specific_05);
          sVar36 = _visitSIMDShift;
          pMVar46 = ABI::wasm2js::SCRATCH_STORE_F32;
          nextResult_35.str._M_str = (char *)cashew::RSHIFT;
          nextResult_35.str._M_len = EXPRESSION_RESULT;
          IVar54.str._M_str = cashew::RSHIFT;
          RVar27 = IString_(this,*(Expression **)((long)local_90 + 0x18),nextResult_35);
          target_08.str._M_str = (char *)RVar27.inst;
          target_08.str._M_len = sVar36;
          RVar27 = cashew::ValueBuilder::makeCall<cashew::Ref>
                             ((ValueBuilder *)pMVar46,target_08,IVar54.str._M_str);
          sVar36 = _finalize;
          pMVar46 = ABI::wasm2js::SCRATCH_LOAD_I32;
          pvVar41 = (void *)0x18;
          pVVar22 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
          pVVar22->type = Null;
          cashew::Value::free(pVVar22,pvVar41);
          pVVar22->type = Number;
          (pVVar22->field_1).str.str._M_len = 0x4000000000000000;
          target_09.str._M_str = (char *)pVVar22;
          target_09.str._M_len = sVar36;
          IVar54.str._M_str =
               cashew::ValueBuilder::makeCall<cashew::Ref>
                         ((ValueBuilder *)pMVar46,target_09,IVar54.str._M_str);
          goto LAB_00148aec;
        }
LAB_00148b24:
        op_09.str._M_str = (char *)RVar27.inst;
        op_09.str._M_len = sVar48;
        IVar54.str._M_str = cashew::ValueBuilder::makeUnary(this_03,op_09,IVar54.str._M_str);
        break;
      }
      switch(IVar57) {
      case TableSizeId:
        nextResult_24.str._M_str = (char *)cashew::RSHIFT;
        nextResult_24.str._M_len = EXPRESSION_RESULT;
        RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_24);
        sVar36 = ___cxa_begin_catch;
        IVar54.str._M_str = cashew::LSHIFT;
        pvVar41 = (void *)0x18;
        pVVar22 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        pVVar22->type = Null;
        cashew::Value::free(pVVar22,pvVar41);
        pVVar22->type = Number;
        pAVar39 = (ArrayStorage *)0x4038000000000000;
        break;
      case TableGrowId:
        nextResult_37.str._M_str = (char *)cashew::RSHIFT;
        nextResult_37.str._M_len = EXPRESSION_RESULT;
        RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_37);
        sVar36 = ___cxa_begin_catch;
        IVar54.str._M_str = cashew::LSHIFT;
        pvVar41 = (void *)0x18;
        pVVar22 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        pVVar22->type = Null;
        cashew::Value::free(pVVar22,pvVar41);
        pVVar22->type = Number;
        pAVar39 = (ArrayStorage *)0x4030000000000000;
        break;
      default:
switchD_0014832c_caseD_31:
        ::wasm::handle_unreachable
                  ("unhandled unary",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                   ,0x6b1);
      case TupleMakeId:
      case I31NewId:
switchD_0014832c_caseD_34:
        nextResult_25.str._M_str = (char *)cashew::RSHIFT;
        nextResult_25.str._M_len = EXPRESSION_RESULT;
        RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_25);
        op_06.str._M_str = (char *)RVar27.inst;
        op_06.str._M_len = sVar11;
        RVar27 = cashew::ValueBuilder::makeUnary(this_00,op_06,IVar54.str._M_str);
        sVar48 = sVar11;
        this_03 = this_00;
        goto LAB_00148b24;
      case TupleExtractId:
      case I31GetId:
switchD_0014832c_caseD_35:
        nextResult_27.str._M_str = (char *)cashew::RSHIFT;
        nextResult_27.str._M_len = EXPRESSION_RESULT;
        RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_27);
        op_07.str._M_str = (char *)RVar27.inst;
        op_07.str._M_len = sVar11;
        RVar27 = cashew::ValueBuilder::makeUnary(this_00,op_07,IVar54.str._M_str);
        op_08.str._M_str = (char *)RVar27.inst;
        op_08.str._M_len = sVar11;
        IVar54.str._M_str = cashew::ValueBuilder::makeUnary(this_00,op_08,IVar54.str._M_str);
        sVar36 = CEIL;
        RVar28.inst = cashew::TRSHIFT.inst;
        pvVar41 = (void *)0x18;
        RVar27.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar27.inst)->type = Null;
        cashew::Value::free(RVar27.inst,pvVar41);
        (RVar27.inst)->type = Number;
        ((RVar27.inst)->field_1).str.str._M_len = 0;
        goto LAB_00148e9e;
      }
      (pVVar22->field_1).arr = pAVar39;
      op_02.str._M_str = (char *)pVVar22;
      op_02.str._M_len = sVar36;
      IVar54.str._M_str =
           cashew::ValueBuilder::makeBinary(RVar27.inst,IVar54.str._M_str,op_02,in_R8);
      sVar36 = _operator_delete;
      RVar28.inst = cashew::RSHIFT;
      pvVar41 = (void *)0x18;
      RVar27.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar27.inst)->type = Null;
      cashew::Value::free(RVar27.inst,pvVar41);
      (RVar27.inst)->type = Number;
      ((RVar27.inst)->field_1).arr = pAVar39;
      goto LAB_00148e9e;
    }
    switch(curr[1]._id) {
    case CallId:
    case CallIndirectId:
      nextResult_03.str._M_str = (char *)cashew::RSHIFT;
      nextResult_03.str._M_len = EXPRESSION_RESULT;
      IVar54.str._M_str = cashew::RSHIFT;
      RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_03);
      op_05.str._M_str = (char *)RVar27.inst;
      op_05.str._M_len = sVar36;
      IVar54.str._M_str = cashew::ValueBuilder::makeUnary(pVVar44,op_05,IVar54.str._M_str);
      goto LAB_0014867c;
    case LocalGetId:
    case LocalSetId:
      puVar37 = &MATH_ABS;
      break;
    case GlobalGetId:
    case GlobalSetId:
      puVar37 = &MATH_CEIL;
      break;
    case LoadId:
    case StoreId:
      puVar37 = &MATH_FLOOR;
      break;
    case ConstId:
    case UnaryId:
      puVar37 = &MATH_TRUNC;
      break;
    case BinaryId:
    case SelectId:
      ::wasm::handle_unreachable
                ("operation should have been removed in previous passes",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                 ,0x707);
    case DropId:
    case ReturnId:
      puVar37 = &MATH_SQRT;
      break;
    default:
      ::wasm::handle_unreachable
                ("unhandled unary float operator",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                 ,0x70a);
    case SIMDLoadStoreLaneId:
      nextResult_34.str._M_str = (char *)cashew::RSHIFT;
      nextResult_34.str._M_len = EXPRESSION_RESULT;
      IVar54.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_34);
      IVar54.str._M_str = (Value *)makeJsCoercion(IVar54.str._M_str,JS_INT);
      goto LAB_00148690;
    case MemoryInitId:
      nextResult_32.str._M_str = (char *)cashew::RSHIFT;
      nextResult_32.str._M_len = EXPRESSION_RESULT;
      IVar54.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_32);
      IVar54.str._M_str = (Value *)makeJsCoercion(IVar54.str._M_str,JS_INT);
      goto LAB_0014893f;
    case DataDropId:
      nextResult_29.str._M_str = (char *)cashew::RSHIFT;
      nextResult_29.str._M_len = EXPRESSION_RESULT;
      RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_29);
      sVar36 = CEIL;
      IVar54.str._M_str = cashew::TRSHIFT.inst;
      pvVar41 = (void *)0x18;
      pVVar22 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar22->type = Null;
      cashew::Value::free(pVVar22,pvVar41);
      pVVar22->type = Number;
      (pVVar22->field_1).str.str._M_len = 0;
      op_00.str._M_str = (char *)pVVar22;
      op_00.str._M_len = sVar36;
      IVar54.str._M_str =
           cashew::ValueBuilder::makeBinary(RVar27.inst,IVar54.str._M_str,op_00,in_R8);
      goto LAB_00148690;
    case MemoryCopyId:
      nextResult_31.str._M_str = (char *)cashew::RSHIFT;
      nextResult_31.str._M_len = EXPRESSION_RESULT;
      RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_31);
      sVar36 = CEIL;
      IVar54.str._M_str = cashew::TRSHIFT.inst;
      pvVar41 = (void *)0x18;
      pVVar22 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar22->type = Null;
      cashew::Value::free(pVVar22,pvVar41);
      pVVar22->type = Number;
      (pVVar22->field_1).str.str._M_len = 0;
      op_01.str._M_str = (char *)pVVar22;
      op_01.str._M_len = sVar36;
      IVar54.str._M_str =
           cashew::ValueBuilder::makeBinary(RVar27.inst,IVar54.str._M_str,op_01,in_R8);
      goto LAB_0014893f;
    case RefFuncId:
      nextResult_28.str._M_str = (char *)cashew::RSHIFT;
      nextResult_28.str._M_len = EXPRESSION_RESULT;
      IVar54.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_28);
LAB_0014893f:
      JVar20 = JS_DOUBLE;
      goto LAB_00148695;
    case RefEqId:
      nextResult_33.str._M_str = (char *)cashew::RSHIFT;
      nextResult_33.str._M_len = EXPRESSION_RESULT;
      IVar54.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_33);
      goto LAB_00148690;
    case TableGetId:
      specific_02.str._M_str = (char *)&switchD_0014712a::switchdataD_0018537c;
      specific_02.str._M_len = ABI::wasm2js::SCRATCH_LOAD_F64;
      puVar33 = &switchD_0014712a::switchdataD_0018537c;
      ABI::wasm2js::ensureHelpers
                (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_STORE_I32,specific_02);
      specific_03.str._M_str = (char *)puVar33;
      specific_03.str._M_len = _parseExpression;
      ABI::wasm2js::ensureHelpers
                (*(wasm2js **)((long)this + 0x20),ABI::wasm2js::SCRATCH_LOAD_F32,specific_03);
      sVar36 = ABI::wasm2js::SCRATCH_LOAD_F64;
      pMVar46 = ABI::wasm2js::SCRATCH_STORE_I32;
      pvVar41 = (void *)0x18;
      pVVar22 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      pVVar22->type = Null;
      cashew::Value::free(pVVar22,pvVar41);
      pVVar22->type = Number;
      (pVVar22->field_1).str.str._M_len = 0x4000000000000000;
      nextResult_30.str._M_str = (char *)cashew::RSHIFT;
      nextResult_30.str._M_len = EXPRESSION_RESULT;
      IVar54.str._M_str = IString_(this,*(Expression **)((long)local_90 + 0x18),nextResult_30);
      target_06.str._M_str = (char *)pVVar22;
      target_06.str._M_len = sVar36;
      RVar27 = cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                         ((ValueBuilder *)pMVar46,target_06,IVar54.str._M_str,in_R8);
      target_07.str._M_str = extraout_RDX_02;
      target_07.str._M_len = _parseExpression;
      IVar54.str._M_str =
           cashew::ValueBuilder::makeCall((ValueBuilder *)ABI::wasm2js::SCRATCH_LOAD_F32,target_07);
LAB_00148aec:
      IVar54.str._M_str = cashew::ValueBuilder::makeSeq(RVar27,IVar54.str._M_str);
      goto LAB_0014869d;
    }
    pVVar44 = (ValueBuilder *)*puVar37;
    sVar36 = puVar37[1];
    nextResult_26.str._M_str = (char *)cashew::RSHIFT;
    nextResult_26.str._M_len = EXPRESSION_RESULT;
    IVar54.str._M_str = cashew::RSHIFT;
    RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_26);
    target_05.str._M_str = (char *)RVar27.inst;
    target_05.str._M_len = sVar36;
    IVar54.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref>(pVVar44,target_05,IVar54.str._M_str);
LAB_0014867c:
    if ((((SpecificExpression<(wasm::Expression::Id)16> *)local_90)->super_Expression).type.id != 4)
    break;
LAB_00148690:
    JVar20 = JS_FLOAT;
    goto LAB_00148695;
  case BinaryId:
    nextResult_09.str._M_str = (char *)cashew::RSHIFT;
    nextResult_09.str._M_len = EXPRESSION_RESULT;
    local_90 = (undefined1  [8])curr;
    IVar54.str._M_str = IString_(this,(Expression *)curr[1].type.id,nextResult_09);
    nextResult_10.str._M_str = (char *)cashew::RSHIFT;
    nextResult_10.str._M_len = EXPRESSION_RESULT;
    RVar27 = IString_(this,*(Expression **)((long)local_90 + 0x20),nextResult_10);
    uVar49 = (((SpecificExpression<(wasm::Expression::Id)16> *)local_90)->super_Expression).type.id;
    if (6 < uVar49) goto LAB_00148eee;
    if ((int)uVar49 - 4U < 2) {
      switch(*(BinaryOp *)((long)local_90 + 0x10)) {
      case AddFloat32:
      case AddFloat64:
        puVar37 = &cashew::PLUS;
        break;
      case SubFloat32:
      case SubFloat64:
        puVar37 = &cashew::MINUS;
        break;
      case MulFloat32:
      case MulFloat64:
        puVar37 = &cashew::MUL;
        break;
      case DivFloat32:
      case DivFloat64:
        puVar37 = &cashew::DIV;
        break;
      default:
        Fatal::Fatal((Fatal *)&stack0xfffffffffffffd78);
        Fatal::operator<<((Fatal *)&stack0xfffffffffffffd78,
                          (char (*) [34])"Unhandled binary float operator: ");
        goto LAB_00149134;
      case MinFloat32:
      case MinFloat64:
        puVar37 = &MATH_MIN;
        goto LAB_001483d9;
      case MaxFloat32:
      case MaxFloat64:
        puVar37 = &MATH_MAX;
LAB_001483d9:
        target_04.str._M_str = (char *)IVar54.str._M_str;
        target_04.str._M_len = puVar37[1];
        IVar54.str._M_str =
             cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                       ((ValueBuilder *)*puVar37,target_04,RVar27,in_R8);
        goto LAB_0014867c;
      }
      op.str._M_str = (char *)RVar27.inst;
      op.str._M_len = puVar37[1];
      IVar54.str._M_str =
           cashew::ValueBuilder::makeBinary(IVar54.str._M_str,(Value *)*puVar37,op,in_R8);
      goto LAB_0014867c;
    }
    if ((int)uVar49 != 2) {
      Fatal::Fatal((Fatal *)&stack0xfffffffffffffd78);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&targetIndexes._M_t._M_impl.super__Rb_tree_header,
                 "Unhandled type in binary: ",0x1a);
      Fatal::operator<<((Fatal *)&stack0xfffffffffffffd78,(Binary **)local_90);
LAB_00149134:
      Fatal::~Fatal((Fatal *)&stack0xfffffffffffffd78);
    }
    switch(*(BinaryOp *)((long)local_90 + 0x10)) {
    case AddInt32:
      puVar37 = &cashew::PLUS;
      break;
    case SubInt32:
      puVar37 = &cashew::MINUS;
      break;
    case MulInt32:
      if (uVar49 == 2) {
        target_10.str._M_str = (char *)IVar54.str._M_str;
        target_10.str._M_len = _finalize;
        IVar54.str._M_str =
             cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref>
                       (MATH_IMUL,target_10,RVar27,in_R8);
        goto LAB_0014869d;
      }
      puVar37 = &cashew::MUL;
      goto LAB_00148e91;
    case DivSInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_SIGNED);
      puVar37 = &cashew::DIV;
      goto LAB_00148dba;
    case DivUInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_UNSIGNED);
      puVar37 = &cashew::DIV;
      goto LAB_00148d58;
    case RemSInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_SIGNED);
      puVar37 = &cashew::MOD;
LAB_00148dba:
      target_00.str._M_str = *puVar37;
      sVar36 = puVar37[1];
      JVar40 = JS_SIGNED;
LAB_00148dc9:
      RVar27.inst = (Value *)makeSigning(RVar27,JVar40);
      goto LAB_00148df0;
    case RemUInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_UNSIGNED);
      puVar37 = &cashew::MOD;
LAB_00148d58:
      target_00.str._M_str = *puVar37;
      sVar36 = puVar37[1];
      JVar40 = JS_UNSIGNED;
      goto LAB_00148dc9;
    case AndInt32:
      puVar37 = &cashew::AND;
      break;
    case OrInt32:
      puVar37 = &cashew::OR;
      break;
    case XorInt32:
      puVar37 = &cashew::XOR;
      break;
    case ShlInt32:
      puVar37 = &cashew::LSHIFT;
      break;
    case ShrSInt32:
      puVar37 = &cashew::RSHIFT;
      break;
    case ShrUInt32:
      puVar37 = &cashew::TRSHIFT.inst;
      break;
    case RotLInt32:
    case RotRInt32:
      ::wasm::handle_unreachable
                ("should be removed already",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                 ,0x791);
    case EqInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_SIGNED);
      puVar37 = &cashew::EQ;
      goto LAB_00148e68;
    case NeInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_SIGNED);
      puVar37 = &cashew::NE;
      goto LAB_00148e68;
    case LtSInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_SIGNED);
      puVar37 = &cashew::LT;
      goto LAB_00148e68;
    case LtUInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_UNSIGNED);
      puVar37 = &cashew::LT;
      goto LAB_00148e40;
    case LeSInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_SIGNED);
      puVar37 = &cashew::LE;
      goto LAB_00148e68;
    case LeUInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_UNSIGNED);
      puVar37 = &cashew::LE;
      goto LAB_00148e40;
    case GtSInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_SIGNED);
      puVar37 = &cashew::GT;
      goto LAB_00148e68;
    case GtUInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_UNSIGNED);
      puVar37 = &cashew::GT;
      goto LAB_00148e40;
    case GeSInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_SIGNED);
      puVar37 = &cashew::GE;
LAB_00148e68:
      RVar28.inst = (Value *)*puVar37;
      sVar36 = puVar37[1];
      JVar40 = JS_SIGNED;
LAB_00148e77:
      RVar27.inst = (Value *)makeSigning(RVar27,JVar40);
      goto LAB_00148e9e;
    case GeUInt32:
      IVar54.str._M_str = (Value *)makeSigning(IVar54.str._M_str,JS_UNSIGNED);
      puVar37 = &cashew::GE;
LAB_00148e40:
      RVar28.inst = (Value *)*puVar37;
      sVar36 = puVar37[1];
      JVar40 = JS_UNSIGNED;
      goto LAB_00148e77;
    default:
      ::wasm::handle_unreachable
                ("unhandled i32 binary operator",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                 ,0x793);
    case EqFloat32:
    case EqFloat64:
      puVar37 = &cashew::EQ;
      goto LAB_00148e91;
    case NeFloat32:
    case NeFloat64:
      puVar37 = &cashew::NE;
      goto LAB_00148e91;
    case LtFloat32:
    case LtFloat64:
      puVar37 = &cashew::LT;
      goto LAB_00148e91;
    case LeFloat32:
    case LeFloat64:
      puVar37 = &cashew::LE;
      goto LAB_00148e91;
    case GtFloat32:
    case GtFloat64:
      puVar37 = &cashew::GT;
      goto LAB_00148e91;
    case GeFloat32:
    case GeFloat64:
      puVar37 = &cashew::GE;
LAB_00148e91:
      RVar28.inst = (Value *)*puVar37;
      sVar36 = puVar37[1];
LAB_00148e9e:
      op_04.str._M_str = (char *)RVar27.inst;
      op_04.str._M_len = sVar36;
      IVar54.str._M_str = cashew::ValueBuilder::makeBinary(IVar54.str._M_str,RVar28,op_04,in_R8);
      goto LAB_0014869d;
    }
    target_00.str._M_str = *puVar37;
    sVar36 = puVar37[1];
LAB_00148df0:
    op_03.str._M_str = (char *)RVar27.inst;
    op_03.str._M_len = sVar36;
    IVar54.str._M_str =
         cashew::ValueBuilder::makeBinary(IVar54.str._M_str,(Ref)target_00.str._M_str,op_03,in_R8);
    JVar20 = ::wasm::wasmToJsType
                       ((wasm *)(((SpecificExpression<(wasm::Expression::Id)16> *)local_90)->
                                super_Expression).type.id,target_00.str._M_str);
LAB_00148695:
    IVar54.str._M_str = (Value *)makeJsCoercion(IVar54.str._M_str,JVar20);
    break;
  case SelectId:
    IVar54.str._M_str = visitSelect(wasm::Select__(this,(Select *)curr);
    break;
  case DropId:
    pEVar42 = *(Expression **)(curr + 1);
    IVar54.str._M_str = _finalize;
    specific_04.str._M_str = NO_RESULT;
LAB_00147a60:
    nextResult_14.str._M_str = (char *)IVar54.str._M_str;
    nextResult_14.str._M_len = (size_t)specific_04.str._M_str;
    IVar54.str._M_str = IString_(this,pEVar42,nextResult_14);
    break;
  case ReturnId:
    target_00.str._M_str = *(uintptr_t *)(curr + 1);
    if ((Expression *)target_00.str._M_str == (Expression *)0x0) {
      IVar54.str._M_str = (Value *)0x0;
    }
    else {
      nextResult_20.str._M_str = (char *)cashew::RSHIFT;
      nextResult_20.str._M_len = EXPRESSION_RESULT;
      IVar54.str._M_str = IString_(this,(Expression *)target_00.str._M_str,nextResult_20);
      if ((*(int *)(*this + 100) != 0) && (*(char *)((long)this + 0x28) == '\0')) {
        target_00.str._M_str = *(undefined8 *)((long)this + 0x18);
        sVar29 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)(*this + 0x330),(key_type *)target_00.str._M_str);
        if (sVar29 == 0) goto LAB_00147ee2;
      }
      JVar20 = ::wasm::wasmToJsType(*(wasm **)(*(long *)(curr + 1) + 8),target_00.str._M_str);
      IVar54.str._M_str = (Value *)makeJsCoercion(IVar54.str._M_str,JVar20);
    }
LAB_00147ee2:
    IVar54.str._M_str = cashew::ValueBuilder::makeReturn(IVar54.str._M_str);
    break;
  case MemorySizeId:
    sVar36 = _visitTry;
    pMVar46 = WASM_MEMORY_SIZE;
    goto LAB_00147d78;
  case MemoryGrowId:
    pwVar45 = *(wasm2js **)((long)this + 0x20);
    if ((*(long **)(pwVar45 + 0x78) == *(long **)(pwVar45 + 0x80)) ||
       (lVar25 = **(long **)(pwVar45 + 0x78), IVar54.str._M_str = *(Value **)(lVar25 + 0x40),
       IVar54.str._M_str <= *(Value **)(lVar25 + 0x38))) goto LAB_00147d4a;
    target_00.str._M_str = *(uintptr_t *)(curr + 1);
    nextResult_15.str._M_str = (char *)cashew::RSHIFT;
    nextResult_15.str._M_len = EXPRESSION_RESULT;
    IVar54.str._M_str = IString_(this,(Expression *)target_00.str._M_str,nextResult_15);
    JVar20 = ::wasm::wasmToJsType(*(wasm **)(*(long *)(curr + 1) + 8),target_00.str._M_str);
    RVar27.inst = (Value *)makeJsCoercion(IVar54.str._M_str,JVar20);
    IVar54.str._M_str = (Value *)curr;
    pVVar44 = pVVar16;
    pMVar46 = pMVar15;
    goto LAB_00148130;
  case NopId:
  case AtomicFenceId:
    IVar54.str._M_str = cashew::ValueBuilder::makeToplevel();
    break;
  case UnreachableId:
    pwVar45 = *(wasm2js **)((long)this + 0x20);
LAB_00147d4a:
    specific_01.str._M_str = (char *)IVar54.str._M_str;
    specific_01.str._M_len = __M_create;
    ABI::wasm2js::ensureHelpers(pwVar45,ABI::wasm2js::TRAP,specific_01);
    specific_04.str._M_str = extraout_RDX;
    sVar36 = __M_create;
    pMVar46 = ABI::wasm2js::TRAP;
LAB_00147d78:
    target_02.str._M_str = specific_04.str._M_str;
    target_02.str._M_len = sVar36;
    IVar54.str._M_str = cashew::ValueBuilder::makeCall((ValueBuilder *)pMVar46,target_02);
    break;
  case AtomicRMWId:
    HVar52 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)(byte)curr[1].field_0x4,*(Expression **)(curr + 2),
                        (Index)curr[1].type.id);
    puVar33 = &switchD_00147795::switchdataD_00185478;
    switch(curr[1]._id) {
    case InvalidId:
      specific_04.str._M_str = "add";
      break;
    case BlockId:
      specific_04.str._M_str = "sub";
      break;
    case IfId:
      specific_04.str._M_str = "and";
      break;
    case LoopId:
      specific_04.str._M_str = "or";
      uVar26 = 2;
      goto LAB_00148242;
    case BreakId:
      specific_04.str._M_str = "xor";
      break;
    case SwitchId:
      specific_04.str._M_str = "exchange";
      uVar26 = 8;
      goto LAB_00148242;
    default:
      ::wasm::handle_unreachable
                ("unimp",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                 ,0x844);
    }
    uVar26 = 3;
LAB_00148242:
    auVar51 = ::wasm::IString::interned(uVar26,specific_04.str._M_str,0);
    pSVar12 = _makeJsCoercedZero;
    pSVar32 = cashew::ATOMICS;
    key_01.str._M_len = auVar51._8_8_;
    pvVar41 = (void *)0x18;
    pVVar22 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar22->type = Null;
    cashew::Value::free(pVVar22,pvVar41);
    pVVar22->type = String;
    (pVVar22->field_1).str.str._M_len = (size_t)pSVar32;
    (pVVar22->field_1).str.str._M_str = (char *)pSVar12;
    key_01.str._M_str = (char *)puVar33;
    IVar54.str._M_str = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar22,auVar51._0_8_,key_01);
    IVar54.str._M_str = cashew::ValueBuilder::makeCall(IVar54.str._M_str);
    cashew::ValueBuilder::appendToCall(IVar54.str._M_str,HVar52.heap.inst);
    cashew::ValueBuilder::appendToCall(IVar54.str._M_str,HVar52.ptr.inst);
    nextResult_23.str._M_str = (char *)cashew::RSHIFT;
    nextResult_23.str._M_len = EXPRESSION_RESULT;
    RVar27 = IString_(this,(Expression *)curr[2].type.id,nextResult_23);
LAB_001482e8:
    cashew::ValueBuilder::appendToCall(IVar54.str._M_str,RVar27);
    break;
  case AtomicCmpxchgId:
    HVar52 = getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
                       (this,(uint)(byte)(char)curr[1]._id,*(Expression **)(curr + 2),
                        (Index)curr[1].type.id);
    nextResult_07.str._M_str = (char *)cashew::RSHIFT;
    nextResult_07.str._M_len = EXPRESSION_RESULT;
    RVar27 = IString_(this,(Expression *)curr[2].type.id,nextResult_07);
    nextResult_08.str._M_str = (char *)cashew::RSHIFT;
    nextResult_08.str._M_len = EXPRESSION_RESULT;
    pVVar22 = cashew::RSHIFT;
    target_00.str._M_str = (uintptr_t)IString_(this,*(Expression **)(curr + 3),nextResult_08);
    pSStack_b8 = cashew::ATOMICS;
    case_ = _makeJsCoercedZero;
    pvVar41 = (void *)0x18;
    this_01 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    this_01->type = Null;
    cashew::Value::free(this_01,pvVar41);
    this_01->type = String;
    (this_01->field_1).str.str._M_len = (size_t)pSStack_b8;
    (this_01->field_1).str.str._M_str = (char *)case_;
    key_00.str._M_str = (char *)pVVar22;
    key_00.str._M_len = _visitAtomicNotify;
    IVar54.str._M_str =
         cashew::ValueBuilder::makeDot((ValueBuilder *)this_01,cashew::COMPARE_EXCHANGE,key_00);
    IVar54.str._M_str = cashew::ValueBuilder::makeCall(IVar54.str._M_str);
    local_60 = HVar52.heap.inst;
    cashew::ValueBuilder::appendToCall(IVar54.str._M_str,local_60);
    local_58 = HVar52.ptr.inst;
    cashew::ValueBuilder::appendToCall(IVar54.str._M_str,local_58);
    cashew::ValueBuilder::appendToCall(IVar54.str._M_str,RVar27);
    cashew::ValueBuilder::appendToCall(IVar54.str._M_str,(Ref)target_00.str._M_str);
    JVar20 = ::wasm::wasmToJsType((wasm *)(curr->type).id,target_00.str._M_str);
    goto LAB_00148695;
  case AtomicWaitId:
  case SIMDExtractId:
  case SIMDReplaceId:
  case SIMDShuffleId:
  case SIMDTernaryId:
  case SIMDShiftId:
  case SIMDLoadId:
  case SIMDLoadStoreLaneId:
  case PopId:
  case RefNullId:
  case RefIsNullId:
  case RefFuncId:
  case RefEqId:
  case TableGetId:
  case TableSetId:
  case TableSizeId:
  case TableGrowId:
  case TryId:
  case ThrowId:
  case RethrowId:
  case TupleMakeId:
  case TupleExtractId:
  case I31NewId:
  case I31GetId:
  case CallRefId:
  case RefTestId:
  case RefCastId:
  case BrOnId:
  case StructNewId:
  case StructGetId:
  case StructSetId:
  case ArrayNewId:
  case ArrayNewSegId:
  case ArrayNewFixedId:
  case ArrayGetId:
  case ArraySetId:
  case ArrayLenId:
  case ArrayCopyId:
  case ArrayFillId:
  case ArrayInitId:
  case RefAsId:
  case StringNewId:
  case StringConstId:
  case StringMeasureId:
  case StringEncodeId:
  case StringConcatId:
  case StringEqId:
  case StringAsId:
  case StringWTF8AdvanceId:
  case StringWTF16GetId:
  case StringIterNextId:
  case StringIterMoveId:
  case StringSliceWTFId:
  case StringSliceIterId:
    unimplemented(wasm::Expression__(curr,(Expression *)&switchD_00146fc9::switchdataD_001850a8);
    goto LAB_00148eb0;
  case AtomicNotifyId:
    pvVar41 = (void *)0x18;
    pVVar22 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar22->type = Null;
    cashew::Value::free(pVVar22,pvVar41);
    pVVar22->type = String;
    local_58.inst._0_4_ = SUB84(pSVar32,0);
    local_58.inst._4_4_ = (undefined4)((ulong)pSVar32 >> 0x20);
    uStack_50 = SUB84(pSVar12,0);
    uStack_4c = (undefined4)((ulong)pSVar12 >> 0x20);
    *(undefined4 *)&pVVar22->field_1 = local_58.inst._0_4_;
    *(undefined4 *)((long)&pVVar22->field_1 + 4) = local_58.inst._4_4_;
    *(undefined4 *)((long)&pVVar22->field_1 + 8) = uStack_50;
    *(undefined4 *)((long)&pVVar22->field_1 + 0xc) = uStack_4c;
    auVar51 = ::wasm::IString::interned(6,"notify",0);
    key.str._M_len = auVar51._8_8_;
    key.str._M_str = (char *)IVar54.str._M_str;
    IVar54.str._M_str = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar22,auVar51._0_8_,key);
    IVar54.str._M_str = cashew::ValueBuilder::makeCall(IVar54.str._M_str);
    specific_04.str._M_str = _visitStringEncode;
    sVar36 = cashew::HEAP32;
    pvVar41 = (void *)0x18;
    RVar27.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar27.inst)->type = Null;
    cashew::Value::free(RVar27.inst,pvVar41);
    (RVar27.inst)->type = String;
    ((RVar27.inst)->field_1).str.str._M_len = sVar36;
    ((RVar27.inst)->field_1).str.str._M_str = specific_04.str._M_str;
    cashew::ValueBuilder::appendToCall(IVar54.str._M_str,RVar27);
    RVar27 = makePointer(wasm::Expression*,wasm::Address_
                       (this,(Expression *)curr[1].type.id,(Address)*(address64_t *)(curr + 1));
    RVar27 = cashew::ValueBuilder::makePtrShift(RVar27,2);
    cashew::ValueBuilder::appendToCall(IVar54.str._M_str,RVar27);
    nextResult_04.str._M_str = (char *)cashew::RSHIFT;
    nextResult_04.str._M_len = EXPRESSION_RESULT;
    RVar27 = IString_(this,*(Expression **)(curr + 2),nextResult_04);
    RVar27.inst = (Value *)makeSigning(RVar27,JS_UNSIGNED);
    goto LAB_001482e8;
  case MemoryInitId:
    IVar54.str._M_len = _finalize;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::MEMORY_INIT,IVar54);
    sVar36 = _finalize;
    pMVar46 = ABI::wasm2js::MEMORY_INIT;
    IVar19 = getDataIndex(*this,(Name)curr[1]);
    pSStack_b8 = (pointer)(double)IVar19;
    pvVar41 = (void *)0x18;
    pVVar22 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    pVVar22->type = Null;
    cashew::Value::free(pVVar22,pvVar41);
    pVVar22->type = Number;
    (pVVar22->field_1).num = (double)pSStack_b8;
    nextResult_00.str._M_str = (char *)cashew::RSHIFT;
    nextResult_00.str._M_len = EXPRESSION_RESULT;
    IVar54.str._M_str = IString_(this,*(Expression **)(curr + 2),nextResult_00);
    nextResult_01.str._M_str = (char *)cashew::RSHIFT;
    nextResult_01.str._M_len = EXPRESSION_RESULT;
    RVar28 = IString_(this,(Expression *)curr[2].type.id,nextResult_01);
    nextResult_02.str._M_str = (char *)cashew::RSHIFT;
    nextResult_02.str._M_len = EXPRESSION_RESULT;
    args_2 = IString_(this,*(Expression **)(curr + 3),nextResult_02);
    RVar27.inst._4_4_ = in_stack_fffffffffffffd7c;
    RVar27.inst._0_1_ = SUB41(in_stack_fffffffffffffd78,0);
    RVar27.inst._1_3_ = SUB43(in_stack_fffffffffffffd78,1);
    target.str._M_str = (char *)pVVar22;
    target.str._M_len = sVar36;
    IVar54.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref,cashew::Ref>
                   ((ValueBuilder *)pMVar46,target,IVar54.str._M_str,RVar28,args_2,RVar27);
    break;
  case DataDropId:
    specific.str._M_str = (char *)IVar54.str._M_str;
    specific.str._M_len = (size_t)_visitRefTest;
    ABI::wasm2js::ensureHelpers(*(wasm2js **)((long)this + 0x20),ABI::wasm2js::DATA_DROP,specific);
    pVVar44 = _visitRefTest;
    pMVar46 = ABI::wasm2js::DATA_DROP;
    IVar19 = getDataIndex(*this,(Name)curr[1]);
    pvVar41 = (void *)0x18;
    RVar27.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar27.inst)->type = Null;
    cashew::Value::free(RVar27.inst,pvVar41);
    (RVar27.inst)->type = Number;
    ((RVar27.inst)->field_1).num = (double)IVar19;
LAB_00148130:
    target_03.str._M_str = (char *)RVar27.inst;
    target_03.str._M_len = (size_t)pVVar44;
    IVar54.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref>
                   ((ValueBuilder *)pMVar46,target_03,IVar54.str._M_str);
    break;
  case MemoryCopyId:
    pwVar45 = *(wasm2js **)((long)this + 0x20);
    puVar37 = &ABI::wasm2js::MEMORY_COPY;
    goto LAB_00147bf9;
  case MemoryFillId:
    pwVar45 = *(wasm2js **)((long)this + 0x20);
    puVar37 = &ABI::wasm2js::MEMORY_FILL;
LAB_00147bf9:
    specific_00.str._M_str = (char *)IVar54.str._M_str;
    specific_00.str._M_len = puVar37[1];
    ABI::wasm2js::ensureHelpers(pwVar45,(Module *)*puVar37,specific_00);
    pVVar44 = (ValueBuilder *)*puVar37;
    sVar36 = puVar37[1];
    nextResult_17.str._M_str = (char *)cashew::RSHIFT;
    nextResult_17.str._M_len = EXPRESSION_RESULT;
    IVar54.str._M_str = IString_(this,*(Expression **)(curr + 1),nextResult_17);
    nextResult_18.str._M_str = (char *)cashew::RSHIFT;
    nextResult_18.str._M_len = EXPRESSION_RESULT;
    RVar27 = IString_(this,(Expression *)curr[1].type.id,nextResult_18);
    nextResult_19.str._M_str = (char *)cashew::RSHIFT;
    nextResult_19.str._M_len = EXPRESSION_RESULT;
    RVar28 = IString_(this,*(Expression **)(curr + 2),nextResult_19);
    target_01.str._M_str = (char *)IVar54.str._M_str;
    target_01.str._M_len = sVar36;
    IVar54.str._M_str =
         cashew::ValueBuilder::makeCall<cashew::Ref,cashew::Ref,cashew::Ref>
                   (pVVar44,target_01,RVar27,RVar28,in_R9);
    break;
  default:
    ::wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
               ,0x45);
  }
LAB_0014869d:
  *(undefined8 *)((long)this + 8) = uVar9;
  *(undefined8 *)((long)this + 0x10) = uVar10;
  return (Ref)IVar54.str._M_str;
}

Assistant:

Ref visit(Expression* curr, IString nextResult) {
      IString old = result;
      result = nextResult;
      Ref ret = OverriddenVisitor::visit(curr);
      // keep it consistent for the rest of this frame, which may call visit on
      // multiple children
      result = old;
      return ret;
    }